

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_playlist.cpp
# Opt level: O0

void __thiscall
CP::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::reorder
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int pos,vector<int,_std::allocator<int>_> *selected)

{
  iterator it_00;
  bool bVar1;
  reference piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *element;
  int local_5c;
  iterator iStack_58;
  int i_1;
  iterator it;
  iterator iStack_48;
  int p;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  int shift;
  int i;
  iterator insert_pos;
  vector<int,_std::allocator<int>_> *selected_local;
  int pos_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local
  ;
  
  insert_pos.ptr = (node *)selected;
  _shift = begin(this);
  for (__range2._4_4_ = 0; __range2._4_4_ < pos; __range2._4_4_ = __range2._4_4_ + 1) {
    list_iterator::operator++((list_iterator *)&shift);
  }
  __range2._0_4_ = 0;
  __end2 = std::vector<int,_std::allocator<int>_>::begin(selected);
  iStack_48 = std::vector<int,_std::allocator<int>_>::end(selected);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    it.ptr._4_4_ = *piVar2;
    iStack_58 = begin(this);
    if (it.ptr._4_4_ < pos) {
      it.ptr._4_4_ = it.ptr._4_4_ - (int)__range2;
    }
    for (local_5c = 0; it_00.ptr = _shift, local_5c < it.ptr._4_4_; local_5c = local_5c + 1) {
      list_iterator::operator++(&stack0xffffffffffffffa8);
    }
    element = list_iterator::operator*(&stack0xffffffffffffffa8);
    insert(this,it_00,element);
    erase(this,iStack_58);
    __range2._0_4_ = (int)__range2 + 1;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  return;
}

Assistant:

void reorder(int pos,std::vector<int> selected) {
      //write your code only here
      iterator insert_pos = begin();
      for (int i = 0; i < pos; ++i) {
        ++insert_pos;
      }
      int shift = 0;
      for (auto p : selected) {
        iterator it = begin();
        if (p < pos) p -= shift;
        for (int i = 0; i < p; ++i) {
          ++it;
        }
        insert(insert_pos, *it);
        erase(it);
        ++shift;
      }
    }